

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O1

void __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Graph
          (Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int vertices)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pGVar7;
  long lVar8;
  ulong uVar9;
  
  uVar9 = (ulong)vertices;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar9;
  uVar4 = SUB168(auVar2 * ZEXT816(0x18),0);
  uVar5 = uVar4 + 8;
  if (0xfffffffffffffff7 < uVar4) {
    uVar5 = 0xffffffffffffffff;
  }
  this->vertexCount = vertices;
  if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  puVar6 = (ulong *)operator_new__(uVar5);
  *puVar6 = uVar9;
  if (vertices != 0) {
    lVar8 = 0;
    do {
      puVar1 = (undefined8 *)
               ((long)&((SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(puVar6 + 1))->head + lVar8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)puVar6 + lVar8 + 0x18) = 0;
      lVar8 = lVar8 + 0x18;
    } while (uVar9 * 0x18 != lVar8);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar9;
  uVar4 = SUB168(auVar3 * ZEXT816(0x48),0);
  uVar5 = uVar4 + 8;
  if (0xfffffffffffffff7 < uVar4) {
    uVar5 = 0xffffffffffffffff;
  }
  this->adjacencyList =
       (SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)(puVar6 + 1);
  uVar4 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x48),8) == 0) {
    uVar4 = uVar5;
  }
  puVar6 = (ulong *)operator_new__(uVar4);
  pGVar7 = (GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(puVar6 + 1);
  *puVar6 = uVar9;
  if (vertices != 0) {
    puVar6 = puVar6 + 4;
    lVar8 = uVar9 * 0x48;
    do {
      puVar6[-2] = (ulong)puVar6;
      puVar6[-1] = 0;
      *(undefined1 *)puVar6 = 0;
      puVar6[2] = (ulong)(puVar6 + 4);
      puVar6[3] = 0;
      *(undefined1 *)(puVar6 + 4) = 0;
      puVar6 = puVar6 + 9;
      lVar8 = lVar8 + -0x48;
    } while (lVar8 != 0);
  }
  this->vertexList = pGVar7;
  if (0 < vertices) {
    uVar4 = 0;
    do {
      pGVar7->index = (int)uVar4;
      uVar4 = uVar4 + 1;
      pGVar7 = pGVar7 + 1;
    } while ((uint)vertices != uVar4);
  }
  return;
}

Assistant:

Graph<T>::Graph(int vertices)
{
  vertexCount = vertices;
  //we need to allocate the memory for the two arrays
  adjacencyList = new SinglyLinkedList<T>[vertices];
  vertexList = new GraphVertex<T>[vertices];

  for(int i = 0; i<vertexCount; i++)
  {
    //set the index of each vertex in the list to i
    vertexList[i].setIndex(i);
  }
}